

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O0

void __thiscall
ArcflowSol::ArcflowSol
          (ArcflowSol *this,Instance *_inst,
          map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *_flow,int _S,
          vector<int,_std::allocator<int>_> *_Ts,int _LOSS)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  runtime_error *prVar6;
  reference ppVar7;
  reference ppVar8;
  char local_3e8 [8];
  char _error_msg__2 [256];
  pair<const_Arc,_int> *kvpair;
  iterator __end1;
  iterator __begin1;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *__range1;
  char local_2b8 [4];
  int fs;
  char _error_msg__1 [256];
  int local_1ac;
  int i_1;
  pattern_pair *pat;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  char _error_msg_ [256];
  int local_6c;
  int local_68;
  int t;
  int i;
  vector<int,_std::allocator<int>_> dem;
  int _LOSS_local;
  vector<int,_std::allocator<int>_> *_Ts_local;
  int _S_local;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *_flow_local;
  Instance *_inst_local;
  ArcflowSol *this_local;
  
  Instance::Instance(&this->inst,_inst);
  std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::map
            (&this->flow,_flow);
  this->S = _S;
  std::vector<int,_std::allocator<int>_>::vector(&this->Ts,_Ts);
  this->LOSS = _LOSS;
  std::vector<int,_std::allocator<int>_>::vector(&this->nbins);
  std::
  vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::vector(&this->sols);
  iVar1 = (this->inst).m;
  std::allocator<int>::allocator((allocator<int> *)((long)&t + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,(long)iVar1,(allocator<int> *)((long)&t + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&t + 3));
  for (local_68 = 0; local_68 < (this->inst).m; local_68 = local_68 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->inst).demands,(long)local_68);
    vVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)local_68);
    *pvVar4 = vVar2;
  }
  this->objvalue = 0;
  std::
  vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::resize(&this->sols,(long)(this->inst).nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(&this->nbins,(long)(this->inst).nbtypes);
  for (local_6c = 0; local_6c < (this->inst).nbtypes; local_6c = local_6c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_6c);
    extract_solution((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)(_error_msg_ + 0xf8),this,(vector<int,_std::allocator<int>_> *)&i,*pvVar4);
    pvVar5 = std::
             vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ::operator[](&this->sols,(long)local_6c);
    std::
    vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::operator=(pvVar5,(vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                        *)(_error_msg_ + 0xf8));
    std::
    vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               *)(_error_msg_ + 0xf8));
    pvVar5 = std::
             vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ::operator[](&this->sols,(long)local_6c);
    bVar3 = is_valid(this,pvVar5,local_6c);
    if (!bVar3) {
      snprintf((char *)&__range2,0x100,"Error: `%s` in \"%s\" line %d",
               "Invalid solution! (capacity)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x1d);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,(char *)&__range2);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar5 = std::
             vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ::operator[](&this->sols,(long)local_6c);
    __end2 = std::
             vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::begin(pvVar5);
    pat = (pattern_pair *)
          std::
          vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::end(pvVar5);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                                  *)&pat);
      if (!bVar3) break;
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
               ::operator*(&__end2);
      iVar1 = ppVar7->first;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(this->inst).Cs,(long)local_6c);
      this->objvalue = iVar1 * *pvVar4 + this->objvalue;
      iVar1 = ppVar7->first;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->nbins,(long)local_6c);
      *pvVar4 = iVar1 + *pvVar4;
      __gnu_cxx::
      __normal_iterator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  for (local_1ac = 0; local_1ac < (this->inst).m; local_1ac = local_1ac + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)local_1ac);
    if (0 < *pvVar4) {
      snprintf(local_2b8,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (demand)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x28);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,local_2b8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __range1._4_4_ = 0;
  __end1 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::begin
                     (&this->flow);
  kvpair = (pair<const_Arc,_int> *)
           std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::end
                     (&this->flow);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&kvpair);
    if (!bVar3) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_Arc,_int>_>::operator*(&__end1);
    __range1._4_4_ = ppVar8->second + __range1._4_4_;
    std::_Rb_tree_iterator<std::pair<const_Arc,_int>_>::operator++(&__end1);
  }
  if (__range1._4_4_ != 0) {
    snprintf(local_3e8,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (flow)",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
             ,0x31);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,local_3e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return;
}

Assistant:

ArcflowSol::ArcflowSol(const Instance &_inst, const std::map<Arc, int> &_flow,
					   int _S, const std::vector<int> &_Ts, int _LOSS) :
		inst(_inst), flow(_flow), S(_S), Ts(_Ts), LOSS(_LOSS) {
	std::vector<int> dem(inst.m);
	for (int i = 0; i < inst.m; i++) {
		dem[i] = inst.demands[i];
	}

	objvalue = 0;
	sols.resize(inst.nbtypes);
	nbins.resize(inst.nbtypes);
	for (int t = 0; t < inst.nbtypes; t++) {
		sols[t] = extract_solution(&dem, Ts[t]);
		if (!is_valid(sols[t], t)) {
			throw_error("Invalid solution! (capacity)");
		}

		for (const pattern_pair &pat : sols[t]) {
			objvalue += pat.first * inst.Cs[t];
			nbins[t] += pat.first;
		}
	}

	for (int i = 0; i < inst.m; i++) {
		if (dem[i] > 0) {
			throw_error("Invalid solution! (demand)");
		}
	}

	int fs = 0;
	for (const auto &kvpair : flow) {
		fs += kvpair.second;
	}
	if (fs != 0) {
		throw_error("Invalid solution! (flow)");
	}
}